

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

Matrix<double> * __thiscall nnad::Matrix<double>::GetCofactor(Matrix<double> *this,int p,int q)

{
  int in_ECX;
  int in_EDX;
  Matrix<double> *in_RSI;
  Matrix<double> *in_RDI;
  int col;
  int row;
  int j;
  int i;
  Matrix<double> *output;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar1;
  undefined4 in_stack_ffffffffffffff98;
  int iVar2;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  allocator<char> local_39;
  string local_38 [8];
  int *in_stack_ffffffffffffffd0;
  double *in_stack_ffffffffffffffd8;
  Matrix<double> *in_stack_ffffffffffffffe0;
  Matrix<double> *this_00;
  
  this_00 = in_RSI;
  if (in_RSI->_Lines != in_RSI->_Columns) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    Error((string *)0x102d7b);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  Matrix((Matrix<double> *)
         (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0) & 0xffffffff00ffffff),
         (int *)CONCAT44(in_RSI->_Lines + -1,in_RSI->_Columns + -1),
         (int *)CONCAT44(0xffffffff,in_stack_ffffffffffffffa0),
         (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  iVar3 = 0;
  for (iVar2 = 0; iVar2 < in_RSI->_Lines; iVar2 = iVar2 + 1) {
    for (iVar1 = 0; iVar1 < in_RSI->_Columns; iVar1 = iVar1 + 1) {
      if ((iVar2 != in_EDX) && (iVar1 != in_ECX)) {
        iVar3 = iVar3 + 1;
        GetElement(in_stack_ffffffffffffffe0,(int *)in_stack_ffffffffffffffd8,
                   in_stack_ffffffffffffffd0);
        SetElement(this_00,(int *)CONCAT44(in_EDX,in_ECX),&in_stack_ffffffffffffffe0->_Lines,
                   in_stack_ffffffffffffffd8);
        if (iVar3 == in_RSI->_Lines + -1) {
          iVar3 = 0;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

Matrix<T> GetCofactor(int p, int q)
    {
      if (_Lines != _Columns)
        Error("GetCofactor: matrix must be square.");

      Matrix<T> output{_Lines-1, _Columns-1};
      int i = 0, j = 0;

      // Looping for each element of the matrix
      for (int row = 0; row < _Lines; row++)
        for (int col = 0; col < _Columns; col++)
          // Copying into temporary matrix only those element which
          // are not in given row and column.
          if (row != p && col != q)
            {
              output.SetElement(i,j++,  this->GetElement(row,col));

              // Row is filled, so increase row index and reset col
              // index.
              if (j == _Lines - 1)
                {
                  j = 0;
                  i++;
                }
            }
      return output;
    }